

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int HashmapFindValue(jx9_hashmap *pMap,jx9_value *pNeedle,jx9_hashmap_node **ppNode,int bStrict)

{
  sxi32 sVar1;
  jx9_value *pSrc;
  uint iNest;
  sxu32 sVar2;
  jx9_hashmap_node *pNode;
  bool bVar3;
  jx9_value sNeedle;
  jx9_value sVal;
  
  pNode = pMap->pFirst;
  sVar2 = pMap->nEntry;
  jx9MemObjInit(pMap->pVm,&sVal);
  jx9MemObjInit(pMap->pVm,&sNeedle);
  do {
    bVar3 = sVar2 == 0;
    sVar2 = sVar2 - 1;
    if (bVar3) {
      return -6;
    }
    pSrc = HashmapExtractNodeValue(pNode);
    if (pSrc != (jx9_value *)0x0) {
      iNest = pSrc->iFlags;
      if (((pNeedle->iFlags | iNest) & 0x20) == 0) {
        jx9MemObjLoad(pSrc,&sVal);
        jx9MemObjLoad(pNeedle,&sNeedle);
        sVar1 = jx9MemObjCmp(&sNeedle,&sVal,(int)ppNode,iNest);
        jx9MemObjRelease(&sVal);
        jx9MemObjRelease(&sNeedle);
        if (sVar1 == 0) {
          return 0;
        }
      }
      else if (iNest == pNeedle->iFlags) {
        return 0;
      }
    }
    pNode = pNode->pPrev;
  } while( true );
}

Assistant:

static int HashmapFindValue(
	jx9_hashmap *pMap,   /* Target hashmap */
	jx9_value *pNeedle,  /* Lookup key */
	jx9_hashmap_node **ppNode, /* OUT: target node on success  */
	int bStrict      /* TRUE for strict comparison */
	)
{
	jx9_hashmap_node *pEntry;
	jx9_value sVal, *pVal;
	jx9_value sNeedle;
	sxi32 rc;
	sxu32 n;
	/* Perform a linear search since we cannot sort the hashmap based on values */
	pEntry = pMap->pFirst;
	n = pMap->nEntry;
	jx9MemObjInit(pMap->pVm, &sVal);
	jx9MemObjInit(pMap->pVm, &sNeedle);
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pVal ){
			if( (pVal->iFlags|pNeedle->iFlags) & MEMOBJ_NULL ){
				sxi32 iF1 = pVal->iFlags;
				sxi32 iF2 = pNeedle->iFlags;
				if( iF1 == iF2 ){
					/* NULL values are equals */
					if( ppNode ){
						*ppNode = pEntry;
					}
					return SXRET_OK;
				}
			}else{
				/* Duplicate value */
				jx9MemObjLoad(pVal, &sVal);
				jx9MemObjLoad(pNeedle, &sNeedle);
				rc = jx9MemObjCmp(&sNeedle, &sVal, bStrict, 0);
				jx9MemObjRelease(&sVal);
				jx9MemObjRelease(&sNeedle);
				if( rc == 0 ){
					if( ppNode ){
						*ppNode = pEntry;
					}
					/* Match found*/
					return SXRET_OK;
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}